

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

void __thiscall KokkosTools::ChromeTracing::State::State(State *this)

{
  uint uVar1;
  Now NVar2;
  char *__name;
  char *__s;
  char *local_80;
  char *fileOutput;
  char *hostname;
  char *mpi_rank;
  State *this_local;
  
  std::ofstream::ofstream(this);
  std::
  vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ::vector(&this->current_stack);
  NVar2 = now();
  (this->my_base_time).impl.__d.__r = (rep)NVar2.impl.__d.__r;
  this->my_mpi_rank = -1;
  this->first = true;
  local_80 = getenv("OMPI_COMM_WORLD_RANK");
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  __s = (char *)malloc(0x100);
  uVar1 = getpid();
  if (local_80 == (char *)0x0) {
    local_80 = "0";
  }
  snprintf(__s,0x100,"%s-%d-%s.json",__name,(ulong)uVar1,local_80);
  this->my_mpi_rank = 0;
  free(__name);
  std::ofstream::open((char *)this,(_Ios_Openmode)__s);
  free(__s);
  std::operator<<((ostream *)this,"[\n");
  std::
  vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
  ::reserve(&this->current_stack,0x14);
  return;
}

Assistant:

State() : my_base_time(now()) {
    char *mpi_rank = getenv("OMPI_COMM_WORLD_RANK");

    char *hostname = (char *)malloc(sizeof(char) * 256);
    gethostname(hostname, 256);

    char *fileOutput = (char *)malloc(sizeof(char) * 256);
    snprintf(fileOutput, 256, "%s-%d-%s.json", hostname, (int)getpid(),
             (NULL == mpi_rank) ? "0" : mpi_rank);
#if defined(USE_MPI) && USE_MPI
    MPI_Comm_rank(MPI_COMM_WORLD, &my_mpi_rank);
#else
    my_mpi_rank = 0;
#endif

    free(hostname);
    outfile.open(fileOutput, std::ios::out);
    free(fileOutput);

    outfile << "[\n";
    current_stack.reserve(20);
  }